

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O2

string * __thiscall
pbrt::GBufferFilm::ToString_abi_cxx11_(string *__return_storage_ptr__,GBufferFilm *this)

{
  _Alloc_hider in_stack_ffffffffffffffc8;
  
  FilmBase::BaseToString_abi_cxx11_((string *)&stack0xffffffffffffffc8,&this->super_FilmBase);
  StringPrintf<std::__cxx11::string,pbrt::RGBColorSpace_const&,float_const&,bool_const&>
            (__return_storage_ptr__,
             (pbrt *)"[ GBufferFilm %s colorSpace: %s maxComponentValue: %f writeFP16: %s ]",
             &stack0xffffffffffffffc8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this->colorSpace,
             (RGBColorSpace *)&this->maxComponentValue,(float *)&this->writeFP16,
             (bool *)in_stack_ffffffffffffffc8._M_p);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  return __return_storage_ptr__;
}

Assistant:

std::string GBufferFilm::ToString() const {
    return StringPrintf("[ GBufferFilm %s colorSpace: %s maxComponentValue: %f "
                        "writeFP16: %s ]",
                        BaseToString(), *colorSpace, maxComponentValue, writeFP16);
}